

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

void __thiscall PhPacker_Arg_q_Test::TestBody(PhPacker_Arg_q_Test *this)

{
  _func_void__Op_any_ptr__Arg_ptr *p_Var1;
  long lVar2;
  long *plVar3;
  char *pcVar4;
  AssertionResult gtest_ar;
  int64_t result;
  int64_t expected;
  string str;
  Message local_80;
  undefined1 local_78 [8];
  _Storage local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  AssertHelper local_58;
  long local_50 [2];
  string local_40;
  
  PhPacker::pack<long,_0>(&local_40,'q',0xf42329fe0);
  PhPacker::unpack((PhPacker *)local_78,'q',&local_40);
  plVar3 = (long *)std::__any_caster<long>((any *)local_78);
  if (plVar3 == (long *)0x0) {
    std::__throw_bad_any_cast();
  }
  lVar2 = *plVar3;
  if (local_78 != (undefined1  [8])0x0) {
    (*(code *)local_78)(3,local_78,0);
    local_78 = (undefined1  [8])0x0;
  }
  local_50[1] = 0xf42329fe0;
  local_50[0] = lVar2;
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_78,"result","expected",local_50,local_50 + 1);
  if (local_78[0] == (PhPacker)0x0) {
    testing::Message::Message(&local_80);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70._M_ptr ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *local_70._M_ptr;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
               ,0xed,pcVar4);
    testing::internal::AssertHelper::operator=(&local_58,&local_80);
  }
  else {
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70._M_ptr !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_78 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_70._M_ptr);
    }
    PhPacker::pack<long,_0>((string *)local_78,'q',0x41);
    std::__cxx11::string::operator=((string *)&local_40,(string *)local_78);
    p_Var1 = (_func_void__Op_any_ptr__Arg_ptr *)(local_78 + 0x10);
    if (local_78 != (undefined1  [8])p_Var1) {
      operator_delete((void *)local_78,local_68._M_allocated_capacity + 1);
    }
    PhPacker::unpack((PhPacker *)local_78,'q',&local_40);
    plVar3 = (long *)std::__any_caster<long>((any *)local_78);
    if (plVar3 == (long *)0x0) {
      std::__throw_bad_any_cast();
    }
    local_50[0] = *plVar3;
    if (local_78 != (undefined1  [8])0x0) {
      (*(code *)local_78)(3,local_78,0);
      local_78 = (undefined1  [8])0x0;
    }
    local_50[1] = 0x41;
    testing::internal::CmpHelperEQ<long,long>
              ((internal *)local_78,"result","expected",local_50,local_50 + 1);
    if (local_78[0] == (PhPacker)0x0) {
      testing::Message::Message(&local_80);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70._M_ptr ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *local_70._M_ptr;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
                 ,0xf2,pcVar4);
      testing::internal::AssertHelper::operator=(&local_58,&local_80);
    }
    else {
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70._M_ptr !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_78 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_70._M_ptr);
      }
      PhPacker::pack<long,_0>((string *)local_78,'q',-0x8000000000000000);
      std::__cxx11::string::operator=((string *)&local_40,(string *)local_78);
      if (local_78 != (undefined1  [8])p_Var1) {
        operator_delete((void *)local_78,local_68._M_allocated_capacity + 1);
      }
      PhPacker::unpack((PhPacker *)local_78,'q',&local_40);
      plVar3 = (long *)std::__any_caster<long>((any *)local_78);
      if (plVar3 == (long *)0x0) {
        std::__throw_bad_any_cast();
      }
      local_50[0] = *plVar3;
      if (local_78 != (undefined1  [8])0x0) {
        (*(code *)local_78)(3,local_78,0);
        local_78 = (undefined1  [8])0x0;
      }
      local_50[1] = 0x8000000000000000;
      testing::internal::CmpHelperEQ<long,long>
                ((internal *)local_78,"result","expected",local_50,local_50 + 1);
      if (local_78[0] == (PhPacker)0x0) {
        testing::Message::Message(&local_80);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70._M_ptr ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *local_70._M_ptr;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
                   ,0xf7,pcVar4);
        testing::internal::AssertHelper::operator=(&local_58,&local_80);
      }
      else {
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70._M_ptr !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(local_78 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_70._M_ptr);
        }
        PhPacker::pack<long,_0>((string *)local_78,'q',0x7fffffffffffffff);
        std::__cxx11::string::operator=((string *)&local_40,(string *)local_78);
        if (local_78 != (undefined1  [8])p_Var1) {
          operator_delete((void *)local_78,local_68._M_allocated_capacity + 1);
        }
        PhPacker::unpack((PhPacker *)local_78,'q',&local_40);
        plVar3 = (long *)std::__any_caster<long>((any *)local_78);
        if (plVar3 == (long *)0x0) {
          std::__throw_bad_any_cast();
        }
        local_50[0] = *plVar3;
        if (local_78 != (undefined1  [8])0x0) {
          (*(code *)local_78)(3,local_78,0);
          local_78 = (undefined1  [8])0x0;
        }
        local_50[1] = 0x7fffffffffffffff;
        testing::internal::CmpHelperEQ<long,long>
                  ((internal *)local_78,"result","expected",local_50,local_50 + 1);
        if (local_78[0] != (PhPacker)0x0) goto LAB_0010f794;
        testing::Message::Message(&local_80);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70._M_ptr ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *local_70._M_ptr;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
                   ,0xfc,pcVar4);
        testing::internal::AssertHelper::operator=(&local_58,&local_80);
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_58);
  if (local_80.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_80.ss_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
LAB_0010f794:
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70._M_ptr !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_70._M_ptr);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(PhPacker, Arg_q)
{
   std::string str = PhPacker::pack<int64_t>('q', int64_t{65535123424ll});
   int64_t result = std::any_cast<int64_t>(PhPacker::unpack('q', str));
   int64_t expected = 65535123424ll;
   GTEST_ASSERT_EQ(result, expected);

   str = PhPacker::pack<int64_t>('q', 65l);
   result = std::any_cast<int64_t>(PhPacker::unpack('q', str));
   expected = 65;
   GTEST_ASSERT_EQ(result, expected);

   str = PhPacker::pack<int64_t>('q', std::numeric_limits<int64_t>::min());
   result = std::any_cast<int64_t>(PhPacker::unpack('q', str));
   expected = std::numeric_limits<int64_t>::min();
   GTEST_ASSERT_EQ(result, expected);

   str = PhPacker::pack<int64_t>('q', std::numeric_limits<int64_t>::max());
   result = std::any_cast<int64_t>(PhPacker::unpack('q', str));
   expected = std::numeric_limits<int64_t>::max();
   GTEST_ASSERT_EQ(result, expected);
}